

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O1

WJTL_STATUS TestUnmarshallBinary(void)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  JL_STATUS JVar7;
  JL_STATUS JVar8;
  JL_STATUS JVar9;
  JL_STATUS JVar10;
  ushort uVar11;
  WJTL_STATUS WVar12;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  size_t errorAtPos;
  uint8_t zero10 [10];
  TestStruct2 theStruct2;
  TestStruct theStruct;
  JlMarshallElement marshalTestStruct [2];
  JlMarshallElement marshalTestStruct2 [3];
  size_t local_2a0;
  ulong local_298;
  JL_STATUS local_290;
  JL_STATUS local_28c;
  uint local_288;
  uint local_284;
  size_t local_280;
  undefined8 local_278;
  undefined2 local_270;
  ulong *local_268;
  long lStack_260;
  char *local_258;
  long lStack_250;
  ulong *local_248;
  long lStack_240;
  long local_238;
  undefined8 uStack_230;
  long local_228;
  JlMarshallElement local_218 [2];
  JlMarshallElement local_158 [3];
  
  memcpy(local_218,&DAT_001417d0,0xc0);
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_2a0 = 0;
  JVar5 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}",local_218,2,
                         &local_238,&local_2a0);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA\',BinaryBlob2:\'8N68mnhWNBI\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67b);
  Condition = local_2a0 == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67c);
  bVar2 = (short)uStack_230 == 0x7473;
  bVar3 = local_238 == 0x6554734973696854;
  WjTestLib_Assert(bVar2 && bVar3,"memcmp( theStruct.FixedBlob, \"ThisIsTest\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67e);
  Condition_00 = local_228 == 0x123456789abcdef0;
  WjTestLib_Assert(Condition_00,"0x123456789ABCDEF0ULL == theStruct.BinaryBlob2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x67f);
  JVar6 = JlUnmarshallFreeStructAllocs(local_218,2,&local_238);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x681);
  memcpy(local_158,&DAT_00141890,0x120);
  local_248 = (ulong *)0x0;
  lStack_240 = 0;
  local_258 = (char *)0x0;
  lStack_250 = 0;
  local_268 = (ulong *)0x0;
  lStack_260 = 0;
  JVar7 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}"
                         ,local_158,3,&local_268,&local_2a0);
  WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:\'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ\',VariableBlob3:null}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x699);
  Condition_01 = local_2a0 == 0;
  WjTestLib_Assert(Condition_01,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69a);
  Condition_02 = local_268 != (ulong *)0x0;
  WjTestLib_Assert(Condition_02,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69c);
  bVar13 = lStack_260 == 10;
  WjTestLib_Assert(bVar13,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69d);
  bVar14 = (short)local_268[1] == 0x3039 && *local_268 == 0x3837363534333231;
  WjTestLib_Assert(bVar14,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x69e);
  bVar15 = local_258 != (char *)0x0;
  WjTestLib_Assert(bVar15,"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a0);
  bVar16 = lStack_250 == 0x1a;
  WjTestLib_Assert(bVar16,"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a1);
  auVar23[0] = -(local_258[10] == 'A');
  auVar23[1] = -(local_258[0xb] == 'A');
  auVar23[2] = -(local_258[0xc] == 'A');
  auVar23[3] = -(local_258[0xd] == 'A');
  auVar23[4] = -(local_258[0xe] == 'B');
  auVar23[5] = -(local_258[0xf] == 'B');
  auVar23[6] = -(local_258[0x10] == 'B');
  auVar23[7] = -(local_258[0x11] == 'B');
  auVar23[8] = -(local_258[0x12] == 'C');
  auVar23[9] = -(local_258[0x13] == 'C');
  auVar23[10] = -(local_258[0x14] == 'C');
  auVar23[0xb] = -(local_258[0x15] == 'C');
  auVar23[0xc] = -(local_258[0x16] == 'D');
  auVar23[0xd] = -(local_258[0x17] == 'D');
  auVar23[0xe] = -(local_258[0x18] == 'D');
  auVar23[0xf] = -(local_258[0x19] == 'D');
  auVar21[0] = -(*local_258 == '1');
  auVar21[1] = -(local_258[1] == '2');
  auVar21[2] = -(local_258[2] == '3');
  auVar21[3] = -(local_258[3] == '4');
  auVar21[4] = -(local_258[4] == '5');
  auVar21[5] = -(local_258[5] == '6');
  auVar21[6] = -(local_258[6] == '7');
  auVar21[7] = -(local_258[7] == '8');
  auVar21[8] = -(local_258[8] == '9');
  auVar21[9] = -(local_258[9] == '0');
  auVar21[10] = -(local_258[10] == 'A');
  auVar21[0xb] = -(local_258[0xb] == 'A');
  auVar21[0xc] = -(local_258[0xc] == 'A');
  auVar21[0xd] = -(local_258[0xd] == 'A');
  auVar21[0xe] = -(local_258[0xe] == 'B');
  auVar21[0xf] = -(local_258[0xf] == 'B');
  auVar21 = auVar21 & auVar23;
  bVar17 = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff;
  WjTestLib_Assert(bVar17,
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a2);
  bVar18 = local_248 == (ulong *)0x0;
  WjTestLib_Assert(bVar18,"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a4);
  bVar19 = lStack_240 == 0;
  WjTestLib_Assert(bVar19,"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6a5);
  JVar8 = JlJsonToStruct("{VariableBlob1:\'AAAAAAAAAAAAAA\'}",local_158,3,&local_268,&local_2a0);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'AAAAAAAAAAAAAA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6aa);
  bVar20 = local_2a0 == 0;
  WjTestLib_Assert(bVar20,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ab);
  local_284 = (uint)(bVar20 &&
                    (bVar17 &&
                    (JVar8 == JL_STATUS_SUCCESS &&
                    (bVar19 && (bVar18 && (bVar14 && (bVar16 && (bVar15 && bVar13))))))));
  bVar13 = lStack_260 == 10;
  WjTestLib_Assert(bVar13,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ad);
  local_278 = 0;
  local_270 = 0;
  bVar14 = (short)local_268[1] == 0 && *local_268 == 0;
  WjTestLib_Assert(bVar14,"memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6af);
  bVar15 = local_258 != (char *)0x0;
  WjTestLib_Assert(bVar15,"(theStruct2.VariableBlob2) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b1);
  bVar16 = lStack_250 == 0x1a;
  WjTestLib_Assert(bVar16,"26 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b2);
  auVar24[0] = -(local_258[10] == 'A');
  auVar24[1] = -(local_258[0xb] == 'A');
  auVar24[2] = -(local_258[0xc] == 'A');
  auVar24[3] = -(local_258[0xd] == 'A');
  auVar24[4] = -(local_258[0xe] == 'B');
  auVar24[5] = -(local_258[0xf] == 'B');
  auVar24[6] = -(local_258[0x10] == 'B');
  auVar24[7] = -(local_258[0x11] == 'B');
  auVar24[8] = -(local_258[0x12] == 'C');
  auVar24[9] = -(local_258[0x13] == 'C');
  auVar24[10] = -(local_258[0x14] == 'C');
  auVar24[0xb] = -(local_258[0x15] == 'C');
  auVar24[0xc] = -(local_258[0x16] == 'D');
  auVar24[0xd] = -(local_258[0x17] == 'D');
  auVar24[0xe] = -(local_258[0x18] == 'D');
  auVar24[0xf] = -(local_258[0x19] == 'D');
  auVar22[0] = -(*local_258 == '1');
  auVar22[1] = -(local_258[1] == '2');
  auVar22[2] = -(local_258[2] == '3');
  auVar22[3] = -(local_258[3] == '4');
  auVar22[4] = -(local_258[4] == '5');
  auVar22[5] = -(local_258[5] == '6');
  auVar22[6] = -(local_258[6] == '7');
  auVar22[7] = -(local_258[7] == '8');
  auVar22[8] = -(local_258[8] == '9');
  auVar22[9] = -(local_258[9] == '0');
  auVar22[10] = -(local_258[10] == 'A');
  auVar22[0xb] = -(local_258[0xb] == 'A');
  auVar22[0xc] = -(local_258[0xc] == 'A');
  auVar22[0xd] = -(local_258[0xd] == 'A');
  auVar22[0xe] = -(local_258[0xe] == 'B');
  auVar22[0xf] = -(local_258[0xf] == 'B');
  auVar22 = auVar22 & auVar24;
  bVar17 = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff;
  WjTestLib_Assert(bVar17,
                   "memcmp( theStruct2.VariableBlob2, \"1234567890AAAABBBBCCCCDDDD\", 26 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b3);
  bVar18 = local_248 == (ulong *)0x0;
  WjTestLib_Assert(bVar18,"(theStruct2.VariableBlob3) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b5);
  bVar19 = lStack_240 == 0;
  WjTestLib_Assert(bVar19,"0 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6b6);
  JVar8 = JlJsonToStruct("{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}"
                         ,local_158,3,&local_268,&local_2a0);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{VariableBlob1:\'MTIzNDU2Nzg5MA\',VariableBlob2:null,VariableBlob3:\'MTIzNDU2Nzg5MA\'}\", marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ba);
  bVar20 = local_2a0 == 0;
  WjTestLib_Assert(bVar20,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bb);
  local_288 = (uint)((bVar20 && (JVar8 == JL_STATUS_SUCCESS && (bVar19 && bVar18))) &&
                    (bVar17 && (bVar14 && (bVar16 && (bVar15 && bVar13)))));
  bVar14 = local_268 != (ulong *)0x0;
  WjTestLib_Assert(bVar14,"(theStruct2.VariableBlob1) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bd);
  bVar15 = lStack_260 == 10;
  WjTestLib_Assert(bVar15,"10 == theStruct2.VariableBlob1Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6be);
  local_298 = (ulong)(ushort)local_268[1] ^ 0x3039 | *local_268 ^ 0x3837363534333231;
  WjTestLib_Assert(local_298 == 0,"memcmp( theStruct2.VariableBlob1, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6bf);
  bVar16 = local_258 == (char *)0x0;
  WjTestLib_Assert(bVar16,"(theStruct2.VariableBlob2) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c1);
  bVar17 = lStack_250 == 0;
  WjTestLib_Assert(bVar17,"0 == theStruct2.VariableBlob2Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c2);
  bVar18 = local_248 != (ulong *)0x0;
  WjTestLib_Assert(bVar18,"(theStruct2.VariableBlob3) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c4);
  bVar19 = lStack_240 == 10;
  WjTestLib_Assert(bVar19,"10 == theStruct2.VariableBlob3Size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c5);
  uVar1 = *local_248;
  uVar11 = (ushort)local_248[1] ^ 0x3039;
  WjTestLib_Assert(uVar11 == 0 && (uVar1 ^ 0x3837363534333231) == 0,
                   "memcmp( theStruct2.VariableBlob3, \"1234567890\", 10 ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c6);
  JVar8 = JlUnmarshallFreeStructAllocs(local_158,3,&local_268);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTestStruct2, ( sizeof(marshalTestStruct2) / sizeof((marshalTestStruct2)[0]) ), &theStruct2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6c8);
  bVar13 = local_298 != 0;
  JVar9 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}",local_218,2,
                         &local_238,&local_2a0);
  WjTestLib_Assert(JVar9 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'c0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6cd);
  local_298 = local_2a0;
  WjTestLib_Assert(local_2a0 == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6ce);
  local_28c = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}",
                             local_218,2,&local_238,&local_2a0);
  WjTestLib_Assert(local_28c == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhpVGhpc0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d3);
  local_280 = local_2a0;
  WjTestLib_Assert(local_2a0 == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d4);
  local_290 = JlJsonToStruct("{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}",local_218,
                             2,&local_238,&local_2a0);
  WjTestLib_Assert(local_290 == JL_STATUS_INVALID_DATA,
                   "(JlJsonToStruct( \"{BinaryBlob2:\'8N68mnhWNBI\',FixedBlob:\'VGhp%0lzVGVzdA\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6d9);
  sVar4 = local_2a0;
  WjTestLib_Assert(local_2a0 == 0x25,"37 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6da);
  JVar10 = JlJsonToStruct("{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}"
                          ,local_218,2,&local_238,&local_2a0);
  WjTestLib_Assert(JVar10 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{FixedBlob:\'VGhpc0lzVGVzdA===\',BinaryBlob2:\'8N68mnhWNBI==Anything ignored after padding\'}\", marshalTestStruct, ( sizeof(marshalTestStruct) / sizeof((marshalTestStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6df);
  WVar12 = WJTL_STATUS_SUCCESS;
  if ((!Condition_02 || (!Condition_01 || (!Condition_00 || !Condition))) ||
      (((JVar5 != JL_STATUS_SUCCESS || JVar6 != JL_STATUS_SUCCESS) || (!bVar2 || !bVar3)) ||
      JVar7 != JL_STATUS_SUCCESS)) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if ((local_284 & 1) == 0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if ((local_288 & 1) == 0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if ((!bVar19 || (!bVar18 || (!bVar17 || (!bVar16 || (!bVar15 || !bVar14))))) ||
      (((uVar11 != 0 || (uVar1 ^ 0x3837363534333231) != 0) || bVar13) || JVar8 != JL_STATUS_SUCCESS)
     ) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_2a0 != 0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (JVar10 != JL_STATUS_SUCCESS) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (sVar4 != 0x25) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_290 != JL_STATUS_INVALID_DATA) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_280 != 0x25) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_28c != JL_STATUS_INVALID_DATA) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (local_298 != 0x25) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (JVar9 != JL_STATUS_INVALID_DATA) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(local_2a0 == 0,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallBinary",0x6e0);
  return WVar12;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallBinary
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint8_t     FixedBlob[10];      // Treat as 80bit binary
        uint64_t    BinaryBlob2;        // Treat as 64bit binary
    } TestStruct;

    JlMarshallElement marshalTestStruct[] =
    {
        JlMarshallBinaryFixed( TestStruct, FixedBlob, "FixedBlob" ),
        JlMarshallBinaryFixed( TestStruct, BinaryBlob2, "BinaryBlob2" ),
    };

    TestStruct theStruct = {{0}};
    size_t errorAtPos = 0;

    // Test success
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA',BinaryBlob2:'8N68mnhWNBI'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( memcmp( theStruct.FixedBlob, "ThisIsTest", 10 ) == 0 );
    JL_ASSERT( 0x123456789ABCDEF0ULL == theStruct.BinaryBlob2 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct, NumElements(marshalTestStruct), &theStruct ) );

    // Now Test with variable sized binary
    typedef struct
    {
        uint8_t*    VariableBlob1;
        size_t      VariableBlob1Size;
        void*       VariableBlob2;
        size_t      VariableBlob2Size;
        uint32_t*   VariableBlob3;
        size_t      VariableBlob3Size;
    } TestStruct2;

    JlMarshallElement marshalTestStruct2[] =
    {
        JlMarshallBinary( TestStruct2, VariableBlob1, VariableBlob1Size, "VariableBlob1" ),
        JlMarshallBinary( TestStruct2, VariableBlob2, VariableBlob2Size, "VariableBlob2" ),
        JlMarshallBinary( TestStruct2, VariableBlob3, VariableBlob3Size, "VariableBlob3" ),
    };

    TestStruct2 theStruct2 = {0};

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:'MTIzNDU2Nzg5MEFBQUFCQkJCQ0NDQ0REREQ',VariableBlob3:null}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    // Now test loading in different data and making sure no memory leak
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'AAAAAAAAAAAAAA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    uint8_t zero10[10] = {0};
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, zero10, 10 ) == 0 );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 26 == theStruct2.VariableBlob2Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob2, "1234567890AAAABBBBCCCCDDDD", 26 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 0 == theStruct2.VariableBlob3Size );

    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{VariableBlob1:'MTIzNDU2Nzg5MA',VariableBlob2:null,VariableBlob3:'MTIzNDU2Nzg5MA'}",
        marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob1 );
    JL_ASSERT( 10 == theStruct2.VariableBlob1Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob1, "1234567890", 10 ) == 0 );

    JL_ASSERT_NULL( theStruct2.VariableBlob2 );
    JL_ASSERT( 0 == theStruct2.VariableBlob2Size );

    JL_ASSERT_NOT_NULL( theStruct2.VariableBlob3 );
    JL_ASSERT( 10 == theStruct2.VariableBlob3Size );
    JL_ASSERT( memcmp( theStruct2.VariableBlob3, "1234567890", 10 ) == 0 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTestStruct2, NumElements(marshalTestStruct2), &theStruct2 ) );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'c0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid values. Fixed buffers have to have the exact sized base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhpVGhpc0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test invalid base 64
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{BinaryBlob2:'8N68mnhWNBI',FixedBlob:'VGhp%0lzVGVzdA'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ), JL_STATUS_INVALID_DATA );
    JL_ASSERT( 37 == errorAtPos );

    // Now test padding character
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{FixedBlob:'VGhpc0lzVGVzdA===',BinaryBlob2:'8N68mnhWNBI==Anything ignored after padding'}",
        marshalTestStruct, NumElements(marshalTestStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    return TestReturn;
}